

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall
cmCTestLaunch::LoadScrapeRules
          (cmCTestLaunch *this,char *purpose,
          vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  undefined1 local_348 [8];
  RegularExpression rex;
  string line;
  ifstream fin;
  string local_40 [8];
  string fname;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *regexps_local;
  char *purpose_local;
  cmCTestLaunch *this_local;
  
  fname.field_2._8_8_ = regexps;
  std::__cxx11::string::string(local_40,(string *)&this->LogDir);
  std::__cxx11::string::operator+=(local_40,"Custom");
  std::__cxx11::string::operator+=(local_40,purpose);
  std::__cxx11::string::operator+=(local_40,".txt");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar3,_Var2);
  std::__cxx11::string::string((string *)&rex.progsize);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)local_348);
  while (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)(line.field_2._M_local_buf + 8),(string *)&rex.progsize,
                            (bool *)0x0,-1), bVar1) {
    bVar1 = cmsys::RegularExpression::compile
                      ((RegularExpression *)local_348,(string *)&rex.progsize);
    if (bVar1) {
      std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                 fname.field_2._8_8_,(value_type *)local_348);
    }
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_348);
  std::__cxx11::string::~string((string *)&rex.progsize);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmCTestLaunch::LoadScrapeRules(
  const char* purpose, std::vector<cmsys::RegularExpression>& regexps)
{
  std::string fname = this->LogDir;
  fname += "Custom";
  fname += purpose;
  fname += ".txt";
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  cmsys::RegularExpression rex;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (rex.compile(line)) {
      regexps.push_back(rex);
    }
  }
}